

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardCommon.cpp
# Opt level: O1

void leopard::xor_mem_2to1(void *x,void *y,void *z,uint64_t bytes)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  if (CpuHasAVX2 == '\0') {
    uVar1 = 0;
    do {
      auVar2 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)z + uVar1),
                                   *(undefined1 (*) [16])((long)y + uVar1),
                                   *(undefined1 (*) [16])((long)x + uVar1),0x96);
      auVar3 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)z + uVar1 + 0x10),
                                   *(undefined1 (*) [16])((long)y + uVar1 + 0x10),
                                   *(undefined1 (*) [16])((long)x + uVar1 + 0x10),0x96);
      auVar4 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)z + uVar1 + 0x20),
                                   *(undefined1 (*) [16])((long)y + uVar1 + 0x20),
                                   *(undefined1 (*) [16])((long)x + uVar1 + 0x20),0x96);
      auVar5 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)z + uVar1 + 0x30),
                                   *(undefined1 (*) [16])((long)y + uVar1 + 0x30),
                                   *(undefined1 (*) [16])((long)x + uVar1 + 0x30),0x96);
      *(undefined1 (*) [16])((long)x + uVar1) = auVar2;
      *(undefined1 (*) [16])((long)x + uVar1 + 0x10) = auVar3;
      *(undefined1 (*) [16])((long)x + uVar1 + 0x20) = auVar4;
      *(undefined1 (*) [16])((long)x + uVar1 + 0x30) = auVar5;
      uVar1 = uVar1 + 0x40;
    } while (bytes != uVar1);
  }
  else {
    if (0x7f < bytes) {
      do {
        auVar6 = vpternlogq_avx512vl(*z,*y,*x,0x96);
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [32])((long)z + 0x20),
                                     *(undefined1 (*) [32])((long)y + 0x20),
                                     *(undefined1 (*) [32])((long)x + 0x20),0x96);
        auVar8 = vpternlogq_avx512vl(*(undefined1 (*) [32])((long)z + 0x40),
                                     *(undefined1 (*) [32])((long)y + 0x40),
                                     *(undefined1 (*) [32])((long)x + 0x40),0x96);
        auVar9 = vpternlogq_avx512vl(*(undefined1 (*) [32])((long)z + 0x60),
                                     *(undefined1 (*) [32])((long)y + 0x60),
                                     *(undefined1 (*) [32])((long)x + 0x60),0x96);
        *(undefined1 (*) [32])x = auVar6;
        *(undefined1 (*) [32])((long)x + 0x20) = auVar7;
        *(undefined1 (*) [32])((long)x + 0x40) = auVar8;
        *(undefined1 (*) [32])((long)x + 0x60) = auVar9;
        x = (void *)((long)x + 0x80);
        y = (void *)((long)y + 0x80);
        z = (void *)((long)z + 0x80);
        bytes = bytes - 0x80;
      } while (0x7f < bytes);
    }
    if (bytes != 0) {
      auVar6 = vpternlogq_avx512vl(*z,*y,*x,0x96);
      auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [32])((long)z + 0x20),
                                   *(undefined1 (*) [32])((long)y + 0x20),
                                   *(undefined1 (*) [32])((long)x + 0x20),0x96);
      *(undefined1 (*) [32])x = auVar6;
      *(undefined1 (*) [32])((long)x + 0x20) = auVar7;
      return;
    }
  }
  return;
}

Assistant:

void xor_mem_2to1(
    void * LEO_RESTRICT x,
    const void * LEO_RESTRICT y,
    const void * LEO_RESTRICT z,
    uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_M256 * LEO_RESTRICT x32 = reinterpret_cast<LEO_M256 *>(x);
        const LEO_M256 * LEO_RESTRICT y32 = reinterpret_cast<const LEO_M256 *>(y);
        const LEO_M256 * LEO_RESTRICT z32 = reinterpret_cast<const LEO_M256 *>(z);
        while (bytes >= 128)
        {
            LEO_M256 x0 = _mm256_xor_si256(_mm256_loadu_si256(x32), _mm256_loadu_si256(y32));
            x0 = _mm256_xor_si256(x0, _mm256_loadu_si256(z32));
            LEO_M256 x1 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 1), _mm256_loadu_si256(y32 + 1));
            x1 = _mm256_xor_si256(x1, _mm256_loadu_si256(z32 + 1));
            LEO_M256 x2 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 2), _mm256_loadu_si256(y32 + 2));
            x2 = _mm256_xor_si256(x2, _mm256_loadu_si256(z32 + 2));
            LEO_M256 x3 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 3), _mm256_loadu_si256(y32 + 3));
            x3 = _mm256_xor_si256(x3, _mm256_loadu_si256(z32 + 3));
            _mm256_storeu_si256(x32, x0);
            _mm256_storeu_si256(x32 + 1, x1);
            _mm256_storeu_si256(x32 + 2, x2);
            _mm256_storeu_si256(x32 + 3, x3);
            x32 += 4, y32 += 4, z32 += 4;
            bytes -= 128;
        };

        if (bytes > 0)
        {
            LEO_M256 x0 = _mm256_xor_si256(_mm256_loadu_si256(x32),     _mm256_loadu_si256(y32));
            x0 = _mm256_xor_si256(x0, _mm256_loadu_si256(z32));
            LEO_M256 x1 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 1), _mm256_loadu_si256(y32 + 1));
            x1 = _mm256_xor_si256(x1, _mm256_loadu_si256(z32 + 1));
            _mm256_storeu_si256(x32, x0);
            _mm256_storeu_si256(x32 + 1, x1);
        }

        return;
    }
#endif // LEO_TRY_AVX2

    LEO_M128 * LEO_RESTRICT x16 = reinterpret_cast<LEO_M128 *>(x);
    const LEO_M128 * LEO_RESTRICT y16 = reinterpret_cast<const LEO_M128 *>(y);
    const LEO_M128 * LEO_RESTRICT z16 = reinterpret_cast<const LEO_M128 *>(z);
    do
    {
        LEO_M128 x0 = _mm_xor_si128(_mm_loadu_si128(x16), _mm_loadu_si128(y16));
        x0 = _mm_xor_si128(x0, _mm_loadu_si128(z16));
        LEO_M128 x1 = _mm_xor_si128(_mm_loadu_si128(x16 + 1), _mm_loadu_si128(y16 + 1));
        x1 = _mm_xor_si128(x1, _mm_loadu_si128(z16 + 1));
        LEO_M128 x2 = _mm_xor_si128(_mm_loadu_si128(x16 + 2), _mm_loadu_si128(y16 + 2));
        x2 = _mm_xor_si128(x2, _mm_loadu_si128(z16 + 2));
        LEO_M128 x3 = _mm_xor_si128(_mm_loadu_si128(x16 + 3), _mm_loadu_si128(y16 + 3));
        x3 = _mm_xor_si128(x3, _mm_loadu_si128(z16 + 3));
        _mm_storeu_si128(x16, x0);
        _mm_storeu_si128(x16 + 1, x1);
        _mm_storeu_si128(x16 + 2, x2);
        _mm_storeu_si128(x16 + 3, x3);
        x16 += 4, y16 += 4, z16 += 4;
        bytes -= 64;
    } while (bytes > 0);
}